

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu.cpp
# Opt level: O1

int __thiscall ncnn::GELU::forward_inplace(GELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  float fVar9;
  
  uVar2 = bottom_top_blob->c;
  uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  if (this->fast_gelu == 0) {
    if (0 < (int)uVar2) {
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->cstep;
      sVar4 = bottom_top_blob->elemsize;
      uVar6 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar7 = 0;
          do {
            fVar1 = *(float *)((long)pvVar8 + uVar7 * 4);
            fVar9 = erfcf(fVar1 * -0.70710677);
            *(float *)((long)pvVar8 + uVar7 * 4) = fVar9 * fVar1 * 0.5;
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
        }
        uVar6 = uVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (uVar6 != uVar2);
    }
  }
  else if (0 < (int)uVar2) {
    pvVar8 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    uVar6 = 0;
    do {
      if (0 < (int)uVar5) {
        uVar7 = 0;
        do {
          fVar1 = *(float *)((long)pvVar8 + uVar7 * 4);
          fVar9 = tanhf((fVar1 * fVar1 * 0.044715 * fVar1 + fVar1) * 0.7978845);
          *(float *)((long)pvVar8 + uVar7 * 4) = (fVar9 + 1.0) * fVar1 * 0.5;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      uVar6 = uVar6 + 1;
      pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
    } while (uVar6 != uVar2);
  }
  return 0;
}

Assistant:

int GELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    if (fast_gelu)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
                ptr[i] = 0.5f * ptr[i] * (1.0f + tanhf(0.79788452f * (ptr[i] + 0.044715f * ptr[i] * ptr[i] * ptr[i])));
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                // y = x * P(X <= x) where X ~ N(0, 1)
                ptr[i] = 0.5f * ptr[i] * erfcf(-0.70710678f * ptr[i]);
            }
        }
    }

    return 0;
}